

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture2DLodControlCase::iterate(Texture2DLodControlCase *this)

{
  pointer *__return_storage_ptr__;
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  Texture2D *this_00;
  undefined4 extraout_var_00;
  char *pcVar8;
  reference pvVar9;
  RenderTarget *this_01;
  PixelFormat *format;
  Texture2D *this_02;
  qpWatchDog *watchDog;
  TestLog *pTVar10;
  MessageBuilder *pMVar11;
  Texture2DView TVar12;
  int local_914;
  int local_910;
  bool local_909;
  int local_8d4;
  int local_8d0;
  allocator<char> local_891;
  undefined1 local_890 [6];
  bool isOk;
  allocator<char> local_869;
  string local_868;
  LogImage local_848;
  allocator<char> local_7b1;
  string local_7b0;
  allocator<char> local_789;
  string local_788;
  LogImage local_768;
  allocator<char> local_6d1;
  string local_6d0;
  allocator<char> local_6a9;
  string local_6a8;
  LogImage local_688;
  allocator<char> local_5f1;
  string local_5f0;
  allocator<char> local_5c9;
  string local_5c8;
  LogImageSet local_5a8;
  MessageBuilder local_568;
  Texture2DView local_3e8;
  PixelBufferAccess local_3d8;
  PixelBufferAccess local_3b0;
  PixelBufferAccess local_388;
  ConstPixelBufferAccess local_360;
  PixelBufferAccess local_338;
  ConstPixelBufferAccess local_310;
  Texture2DView local_2e8;
  SurfaceAccess local_2d8;
  uint local_2b8;
  int local_2b4;
  int cellNdx_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int gridX_1;
  int gridY_1;
  Vector<int,_4> local_288;
  Vector<int,_4> local_278;
  IVec4 local_268;
  tcu local_258 [8];
  float afStack_250 [2];
  Vector<int,_3> local_248;
  Vector<int,_3> local_23c;
  int local_230;
  undefined1 local_22c [4];
  int numFailedPixels;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Surface errorMask;
  Surface referenceFrame;
  bool isTrilinear;
  PixelFormat *pixelFormat;
  uint local_188;
  int local_184;
  int cellNdx;
  int curH;
  int curW;
  int curY;
  int curX;
  int gridX;
  int gridY;
  int cellHeight;
  int cellWidth;
  int gridHeight;
  int gridWidth;
  undefined1 local_150 [8];
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_e4 [8];
  ReferenceParams sampleParams;
  RandomViewport viewport;
  RenderTarget *renderTarget;
  int texHeight;
  int texWidth;
  Texture2D *refTexture;
  deUint32 magFilter;
  deUint32 wrapT;
  deUint32 wrapS;
  Functions *gl;
  Texture2DLodControlCase *this_local;
  long lVar7;
  
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar2);
  this_00 = glu::Texture2D::getRefTexture(this->m_texture);
  iVar2 = tcu::Texture2D::getWidth(this_00);
  iVar3 = tcu::Texture2D::getHeight(this_00);
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[4])();
  pcVar8 = tcu::TestNode::getName((TestNode *)this);
  dVar5 = deStringHash(pcVar8);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&sampleParams.baseLevel,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar4),iVar2 << 2,iVar3 << 2,dVar5);
  __return_storage_ptr__ =
       &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  glu::mapGLSampler((Sampler *)__return_storage_ptr__,0x2901,0x2901,this->m_minFilter,0x2600);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_e4,TEXTURETYPE_2D,(Sampler *)__return_storage_ptr__,
             LODMODE_EXACT);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_150,viewport.x,viewport.y);
  cellWidth = 4;
  cellHeight = 4;
  iVar2 = viewport.x;
  if (viewport.x < 0) {
    iVar2 = viewport.x + 3;
  }
  gridY = iVar2 >> 2;
  iVar2 = viewport.y;
  if (viewport.y < 0) {
    iVar2 = viewport.y + 3;
  }
  gridX = iVar2 >> 2;
  (*this->m_texture->_vptr_Texture2D[2])();
  pcVar1 = *(code **)(lVar7 + 0xb8);
  dVar5 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar5);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2802,0x2901);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2803,0x2901);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,this->m_minFilter);
  (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"After texture setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x5f5);
  for (curX = 0; curX < 4; curX = curX + 1) {
    for (curY = 0; curY < 4; curY = curY + 1) {
      curW = gridY * curY;
      curH = gridX * curX;
      if (curY == 3) {
        local_8d0 = viewport.x - curW;
      }
      else {
        local_8d0 = gridY;
      }
      cellNdx = local_8d0;
      if (curX == 3) {
        local_8d4 = viewport.y - curH;
      }
      else {
        local_8d4 = gridX;
      }
      local_184 = local_8d4;
      local_188 = curY + curX * 4;
      getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                         local_188);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                (this,(ulong)local_188);
      (**(code **)(lVar7 + 0x1a00))
                (sampleParams.baseLevel + curW,sampleParams.maxLevel + curH,cellNdx,local_184);
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
      deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
                (&this->m_renderer,0,pvVar9,(RenderParams *)local_e4);
    }
  }
  pRVar6 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess((PixelBufferAccess *)&pixelFormat,(Surface *)local_150);
  glu::readPixels(pRVar6,sampleParams.baseLevel,sampleParams.maxLevel,
                  (PixelBufferAccess *)&pixelFormat);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"Read pixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureMipmapTests.cpp"
                  ,0x60d);
  this_01 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  format = tcu::RenderTarget::getPixelFormat(this_01);
  local_909 = true;
  if (this->m_minFilter != 0x2702) {
    local_909 = this->m_minFilter == 0x2703;
  }
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,viewport.x,viewport.y);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)local_22c,RULE_OPENGL);
  local_230 = 0;
  tcu::Vector<int,_3>::Vector(&local_23c,0x14,0x14,0);
  lookupPrec.coordBits.m_data[0] = local_23c.m_data[2];
  lodPrec.derivateBits = local_23c.m_data[0];
  lodPrec.lodBits = local_23c.m_data[1];
  tcu::Vector<int,_3>::Vector(&local_248,0x10,0x10,0);
  lookupPrec.uvwBits.m_data[0] = local_248.m_data[2];
  lookupPrec.coordBits.m_data[1] = local_248.m_data[0];
  lookupPrec.coordBits.m_data[2] = local_248.m_data[1];
  glu::TextureTestUtil::getBitsVec((TextureTestUtil *)&local_288,format);
  tcu::operator-((tcu *)&local_278,&local_288,local_909 + 1);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&gridY_1,0);
  tcu::max<int,4>((tcu *)&local_268,&local_278,(Vector<int,_4> *)&gridY_1);
  tcu::computeFixedPointThreshold(local_258,&local_268);
  lookupPrec.uvwBits.m_data._4_8_ = local_258;
  lookupPrec.colorThreshold.m_data[0] = afStack_250[0];
  lookupPrec.colorThreshold.m_data[1] = afStack_250[1];
  glu::TextureTestUtil::getCompareMask((TextureTestUtil *)&gridX_1,format);
  lookupPrec.colorThreshold.m_data[2] = (float)gridX_1;
  numFailedPixels = 10;
  lodPrec.rule = 8;
  for (curX_1 = 0; curX_1 < 4; curX_1 = curX_1 + 1) {
    for (curY_1 = 0; curY_1 < 4; curY_1 = curY_1 + 1) {
      curW_1 = gridY * curY_1;
      curH_1 = gridX * curX_1;
      if (curY_1 == 3) {
        local_910 = viewport.x - curW_1;
      }
      else {
        local_910 = gridY;
      }
      cellNdx_1 = local_910;
      if (curX_1 == 3) {
        local_914 = viewport.y - curH_1;
      }
      else {
        local_914 = gridX;
      }
      local_2b4 = local_914;
      local_2b8 = curY_1 + curX_1 * 4;
      getBasicTexCoord2D((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
                         local_2b8);
      (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                (this,local_e4,(ulong)local_2b8);
      tcu::SurfaceAccess::SurfaceAccess
                (&local_2d8,(Surface *)&errorMask.m_pixels.m_cap,format,curW_1,curH_1,cellNdx_1,
                 local_2b4);
      TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(this_00);
      local_2e8.m_levels = TVar12.m_levels;
      local_2e8.m_numLevels = TVar12.m_numLevels;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
      glu::TextureTestUtil::sampleTexture(&local_2d8,&local_2e8,pvVar9,(ReferenceParams *)local_e4);
      tcu::Surface::getAccess(&local_338,(Surface *)local_150);
      tcu::getSubregion((PixelBufferAccess *)&local_310,&local_338,curW_1,curH_1,cellNdx_1,local_2b4
                       );
      tcu::Surface::getAccess(&local_388,(Surface *)&errorMask.m_pixels.m_cap);
      tcu::getSubregion((PixelBufferAccess *)&local_360,&local_388,curW_1,curH_1,cellNdx_1,local_2b4
                       );
      tcu::Surface::getAccess(&local_3d8,(Surface *)&lookupPrec.colorMask);
      tcu::getSubregion(&local_3b0,&local_3d8,curW_1,curH_1,cellNdx_1,local_2b4);
      this_02 = glu::Texture2D::getRefTexture(this->m_texture);
      TVar12 = tcu::Texture2D::operator_cast_to_Texture2DView(this_02);
      local_3e8.m_levels = TVar12.m_levels;
      local_3e8.m_numLevels = TVar12.m_numLevels;
      pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
      watchDog = tcu::TestContext::getWatchDog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      iVar2 = glu::TextureTestUtil::computeTextureLookupDiff
                        (&local_310,&local_360,&local_3b0,&local_3e8,pvVar9,
                         (ReferenceParams *)local_e4,(LookupPrecision *)&lodPrec.derivateBits,
                         (LodPrecision *)local_22c,watchDog);
      local_230 = iVar2 + local_230;
    }
  }
  if (0 < local_230) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_568,pTVar10,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<
                        (&local_568,(char (*) [41])"ERROR: Image verification failed, found ");
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_230);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_568);
  }
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5c8,"Result",&local_5c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f0,"Verification result",&local_5f1);
  tcu::LogImageSet::LogImageSet(&local_5a8,&local_5c8,&local_5f0);
  pTVar10 = tcu::TestLog::operator<<(pTVar10,&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6a8,"Rendered",&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6d0,"Rendered image",&local_6d1);
  tcu::LogImage::LogImage
            (&local_688,&local_6a8,&local_6d0,(Surface *)local_150,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar10,&local_688);
  tcu::LogImage::~LogImage(&local_688);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator(&local_6a9);
  tcu::LogImageSet::~LogImageSet(&local_5a8);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  if (0 < local_230) {
    pTVar10 = tcu::TestContext::getLog
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_788,"Reference",&local_789);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7b0,"Ideal reference",&local_7b1);
    tcu::LogImage::LogImage
              (&local_768,&local_788,&local_7b0,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar10 = tcu::TestLog::operator<<(pTVar10,&local_768);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_868,"ErrorMask",&local_869);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_890,"Error mask",&local_891);
    tcu::LogImage::LogImage
              (&local_848,&local_868,(string *)local_890,(Surface *)&lookupPrec.colorMask,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar10,&local_848);
    tcu::LogImage::~LogImage(&local_848);
    std::__cxx11::string::~string((string *)local_890);
    std::allocator<char>::~allocator(&local_891);
    std::__cxx11::string::~string((string *)&local_868);
    std::allocator<char>::~allocator(&local_869);
    tcu::LogImage::~LogImage(&local_768);
    std::__cxx11::string::~string((string *)&local_7b0);
    std::allocator<char>::~allocator(&local_7b1);
    std::__cxx11::string::~string((string *)&local_788);
    std::allocator<char>::~allocator(&local_789);
  }
  pTVar10 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(pTVar10,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  pcVar8 = "Image verification failed";
  if (local_230 == 0) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~(local_230 == 0) & QP_TEST_RESULT_FAIL,pcVar8);
  tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  tcu::Surface::~Surface((Surface *)local_150);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  return STOP;
}

Assistant:

Texture2DLodControlCase::IterateResult Texture2DLodControlCase::iterate (void)
{
	const glw::Functions&		gl					= m_context.getRenderContext().getFunctions();

	const deUint32				wrapS				= GL_REPEAT;
	const deUint32				wrapT				= GL_REPEAT;
	const deUint32				magFilter			= GL_NEAREST;

	const tcu::Texture2D&		refTexture			= m_texture->getRefTexture();
	const int					texWidth			= refTexture.getWidth();
	const int					texHeight			= refTexture.getHeight();

	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const RandomViewport		viewport			(renderTarget, texWidth*4, texHeight*4, deStringHash(getName()));

	ReferenceParams				sampleParams		(TEXTURETYPE_2D, glu::mapGLSampler(wrapS, wrapT, m_minFilter, magFilter));
	vector<float>				texCoord;
	tcu::Surface				renderedFrame		(viewport.width, viewport.height);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth			= 4;
	const int					gridHeight			= 4;
	const int					cellWidth			= viewport.width / gridWidth;
	const int					cellHeight			= viewport.height / gridHeight;

	// Upload texture data.
	m_texture->upload();

	// Bind gradient texture and setup sampler parameters.
	gl.bindTexture	(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "After texture setup");

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			int				curX		= cellWidth*gridX;
			int				curY		= cellHeight*gridY;
			int				curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
			int				curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
			int				cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			getBasicTexCoord2D(texCoord, cellNdx);

			// Render with GL.
			setTextureParams(cellNdx);
			gl.viewport(viewport.x+curX, viewport.y+curY, curW, curH);
			m_renderer.renderQuad(0, &texCoord[0], sampleParams);
		}
	}

	glu::readPixels(m_context.getRenderContext(), viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels");

	// Compare and log.
	{
		const tcu::PixelFormat&	pixelFormat		= m_context.getRenderTarget().getPixelFormat();
		const bool				isTrilinear		= m_minFilter == GL_NEAREST_MIPMAP_LINEAR || m_minFilter == GL_LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewport.width, viewport.height);
		tcu::Surface			errorMask		(viewport.width, viewport.height);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int		curX		= cellWidth*gridX;
				const int		curY		= cellHeight*gridY;
				const int		curW		= gridX+1 == gridWidth ? (viewport.width-curX) : cellWidth;
				const int		curH		= gridY+1 == gridHeight ? (viewport.height-curY) : cellHeight;
				const int		cellNdx		= gridY*gridWidth + gridX;

				getBasicTexCoord2D(texCoord, cellNdx);
				getReferenceParams(sampleParams, cellNdx);

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  refTexture, &texCoord[0], sampleParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getRefTexture(), &texCoord[0], sampleParams,
															lookupPrec, lodPrec, m_testCtx.getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_testCtx.getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_testCtx.getLog() << TestLog::ImageSet("Result", "Verification result")
							<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_testCtx.getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
								<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_testCtx.getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image verification failed");
		}
	}

	return STOP;
}